

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O2

void Gia_WriteDotAig(Gia_Man_t *p,char *pFileName,Vec_Int_t *vBold,Vec_Int_t *vAdds,Vec_Int_t *vXors
                    ,Vec_Int_t *vMapAdds,Vec_Int_t *vMapXors,Vec_Int_t *vOrder)

{
  Vec_Int_t *p_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  FILE *__stream;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  int iVar10;
  char *pcVar11;
  uint uVar12;
  bool bVar13;
  size_t sStack_90;
  
  uVar1 = Ree_ManCountFadds(vAdds);
  iVar2 = Gia_ManAndNum(p);
  if (2000 < iVar2) {
    fprintf(_stdout,"Cannot visualize AIG with more than %d nodes.\n",2000);
    return;
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    return;
  }
  if (vBold != (Vec_Int_t *)0x0) {
    for (iVar2 = 0; iVar2 < vBold->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(vBold,iVar2);
      pGVar8 = Gia_ManObj(p,iVar3);
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      pGVar8->field_0x3 = pGVar8->field_0x3 | 0x40;
    }
  }
  uVar9 = (ulong)(uint)p->nLevels;
  uVar4 = p->nLevels + 1;
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar8 = Gia_ManCo(p,iVar2);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    p_00 = p->vLevels;
    iVar3 = Gia_ObjId(p,pGVar8);
    Vec_IntWriteEntry(p_00,iVar3,uVar4);
  }
  fprintf(__stream,"# %s\n","AIG structure generated by GIA package");
  fputc(10,__stream);
  fwrite("digraph AIG {\n",0xe,1,__stream);
  fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
  fwrite("center = true;\n",0xf,1,__stream);
  fwrite("edge [dir = back];\n",0x13,1,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
  fwrite("  edge [style = invis];\n",0x18,1,__stream);
  fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
  fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
  for (uVar12 = uVar4; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
    fprintf(__stream,"  Level%d",(ulong)uVar12);
    fwrite(" [label = ",10,1,__stream);
    fputc(0x22,__stream);
    fputc(0x22,__stream);
    fwrite("];\n",3,1,__stream);
  }
  fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
  uVar12 = uVar4;
  while (-1 < (int)uVar12) {
    fprintf(__stream,"  Level%d",(ulong)uVar12);
    bVar13 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (bVar13) {
      fputc(0x3b,__stream);
    }
    else {
      fwrite(" ->",3,1,__stream);
    }
  }
  fputc(10,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle1;\n",0xf,1,__stream);
  fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=20,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fputs("AIG structure visualized by ABC",__stream);
  fwrite("\\n",2,1,__stream);
  fprintf(__stream,"Benchmark \\\"%s\\\". ","aig");
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle2;\n",0xf,1,__stream);
  fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=18,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  uVar12 = Gia_ManAndNum(p);
  fprintf(__stream,
          "The AIG contains %d nodes, %d full-adders, and %d half-adders, and spans %d levels.",
          (ulong)uVar12,(ulong)uVar1,(ulong)(vAdds->nSize / 6 - uVar1),uVar9);
  fwrite("\\n",2,1,__stream);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fprintf(__stream,"  Level%d;\n",(ulong)uVar4);
  bVar13 = false;
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar8 = Gia_ManCo(p,iVar2);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjFaninId0p(p,pGVar8);
    if (iVar3 == 0) {
      bVar13 = true;
    }
    uVar1 = Gia_ObjId(p,pGVar8);
    uVar4 = Gia_ObjId(p,pGVar8);
    fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar4);
    fprintf(__stream,", shape = %s","invtriangle");
    fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
    fwrite("];\n",3,1,__stream);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  while( true ) {
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    iVar2 = (int)uVar9;
    if (iVar2 < 1) break;
    fprintf(__stream,"  Level%d;\n",uVar9);
    for (iVar3 = 0; iVar3 < vOrder->nSize; iVar3 = iVar3 + 1) {
      iVar5 = Vec_IntEntry(vOrder,iVar3);
      pGVar8 = Gia_ManObj(p,iVar5);
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      uVar1 = Gia_ObjId(p,pGVar8);
      iVar5 = Gia_ObjLevel(p,pGVar8);
      if (iVar5 == iVar2) {
        if ((pGVar8->field_0x3 & 0x40) == 0) {
          iVar5 = Vec_IntEntry(vMapAdds,uVar1);
          if (iVar5 < 0) goto LAB_0062b595;
          iVar5 = Vec_IntEntry(vMapAdds,uVar1);
          uVar1 = Gia_ShowAddOut(vAdds,vMapAdds,uVar1);
          iVar5 = iVar5 * 6;
          uVar4 = Vec_IntEntry(vAdds,iVar5 + 3);
          uVar12 = Vec_IntEntry(vAdds,iVar5 + 4);
          fprintf(__stream,"  Node%d [label = \"%d_%d\"",(ulong)uVar1,(ulong)uVar4,(ulong)uVar12);
          iVar5 = Vec_IntEntry(vAdds,iVar5 + 2);
          if (iVar5 == 0) {
            pcVar11 = ", shape = octagon";
            sStack_90 = 0x11;
          }
          else {
            pcVar11 = ", shape = doubleoctagon";
            sStack_90 = 0x17;
          }
          fwrite(pcVar11,sStack_90,1,__stream);
        }
        else {
LAB_0062b595:
          iVar5 = Vec_IntEntry(vMapXors,uVar1);
          if (iVar5 < 0) {
            iVar5 = Gia_ObjIsXor(pGVar8);
            if (iVar5 == 0) {
              iVar5 = Gia_ObjIsMux(p,pGVar8);
              fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar1);
              if (iVar5 == 0) {
                pcVar11 = ", shape = ellipse";
                sStack_90 = 0x11;
              }
              else {
                pcVar11 = ", shape = trapezium";
                sStack_90 = 0x13;
              }
              fwrite(pcVar11,sStack_90,1,__stream);
              goto LAB_0062b667;
            }
          }
          fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar1);
          fwrite(", shape = doublecircle",0x16,1,__stream);
        }
LAB_0062b667:
        if ((pGVar8->field_0x3 & 0x40) != 0) {
          fwrite(", style = filled",0x10,1,__stream);
        }
        fwrite("];\n",3,1,__stream);
      }
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    uVar9 = (ulong)(iVar2 - 1);
  }
  fprintf(__stream,"  Level%d;\n",0);
  if (bVar13) {
    fprintf(__stream,"  Node%d [label = \"Const0\"",0);
    fwrite(", shape = ellipse",0x11,1,__stream);
    fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
    fwrite("];\n",3,1,__stream);
  }
  for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
    pGVar8 = Gia_ManCi(p,iVar2);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjId(p,pGVar8);
    uVar4 = Gia_ObjId(p,pGVar8);
    fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar4);
    fprintf(__stream,", shape = %s","triangle");
    fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
    fwrite("];\n",3,1,__stream);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar8 = Gia_ManCo(p,iVar2);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjId(p,pGVar8);
    fprintf(__stream,"title2 -> Node%d [style = invis];\n",(ulong)uVar1);
  }
  uVar9 = 0xffffffffffffffff;
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar8 = Gia_ManCo(p,iVar2);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    if (iVar2 != 0) {
      uVar1 = Gia_ObjId(p,pGVar8);
      fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar9 & 0xffffffff,(ulong)uVar1);
    }
    uVar1 = Gia_ObjId(p,pGVar8);
    uVar9 = (ulong)uVar1;
  }
  uVar9 = 0xffffffffffffffff;
  for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
    pGVar8 = Gia_ManCi(p,iVar2);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    if (iVar2 != 0) {
      uVar1 = Gia_ObjId(p,pGVar8);
      fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar9 & 0xffffffff,(ulong)uVar1);
    }
    uVar1 = Gia_ObjId(p,pGVar8);
    uVar9 = (ulong)uVar1;
  }
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar8 = Gia_ManCo(p,iVar2);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjId(p,pGVar8);
    fprintf(__stream,"Node%d",(ulong)uVar1);
    fwrite(" -> ",4,1,__stream);
    uVar1 = Gia_ShowAddOut(vAdds,vMapAdds,uVar1 - (*(uint *)pGVar8 & 0x1fffffff));
    fprintf(__stream,"Node%d",(ulong)uVar1);
    fwrite(" [",2,1,__stream);
    pcVar11 = "dotted";
    if ((*(uint *)pGVar8 >> 0x1d & 1) == 0) {
      pcVar11 = "solid";
    }
    fprintf(__stream,"style = %s",pcVar11);
    fputc(0x5d,__stream);
    fwrite(";\n",2,1,__stream);
  }
  iVar2 = 0;
  while( true ) {
    if (vOrder->nSize <= iVar2) break;
    iVar3 = Vec_IntEntry(vOrder,iVar2);
    pGVar8 = Gia_ManObj(p,iVar3);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjId(p,pGVar8);
    iVar3 = Gia_ObjId(p,pGVar8);
    iVar3 = Vec_IntEntry(vMapAdds,iVar3);
    if (iVar3 < 0) {
      iVar3 = Gia_ObjId(p,pGVar8);
      iVar3 = Vec_IntEntry(vMapXors,iVar3);
      if (iVar3 < 0) {
        fprintf(__stream,"Node%d",(ulong)uVar1);
        fwrite(" -> ",4,1,__stream);
        uVar4 = Gia_ShowAddOut(vAdds,vMapAdds,uVar1 - (*(uint *)pGVar8 & 0x1fffffff));
        fprintf(__stream,"Node%d",(ulong)uVar4);
        fwrite(" [",2,1,__stream);
        pcVar11 = "dotted";
        if ((*(uint *)pGVar8 >> 0x1d & 1) == 0) {
          pcVar11 = "solid";
        }
        fprintf(__stream,"style = %s",pcVar11);
        fputc(0x5d,__stream);
        fwrite(";\n",2,1,__stream);
        if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
          fprintf(__stream,"Node%d",(ulong)uVar1);
          fwrite(" -> ",4,1,__stream);
          uVar4 = Gia_ShowAddOut(vAdds,vMapAdds,uVar1 - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff));
          fprintf(__stream,"Node%d",(ulong)uVar4);
          fwrite(" [",2,1,__stream);
          pcVar11 = "dotted";
          if ((*(ulong *)pGVar8 >> 0x3d & 1) == 0) {
            pcVar11 = "solid";
          }
          fprintf(__stream,"style = %s",pcVar11);
          fputc(0x5d,__stream);
          fwrite(";\n",2,1,__stream);
          iVar3 = Gia_ObjIsMux(p,pGVar8);
          if (iVar3 != 0) {
            fprintf(__stream,"Node%d",(ulong)uVar1);
            fwrite(" -> ",4,1,__stream);
            iVar3 = Gia_ObjFaninId2(p,uVar1);
            uVar1 = Gia_ShowAddOut(vAdds,vMapAdds,iVar3);
            fprintf(__stream,"Node%d",(ulong)uVar1);
            fwrite(" [",2,1,__stream);
            iVar3 = Gia_ObjFaninC2(p,pGVar8);
            pcVar11 = "dotted";
            if (iVar3 == 0) {
              pcVar11 = "solid";
            }
            fprintf(__stream,"style = %s",pcVar11);
            fputc(0x5d,__stream);
            fwrite(";\n",2,1,__stream);
          }
        }
      }
      else {
        iVar3 = Vec_IntEntry(vMapXors,uVar1);
        for (iVar5 = 1; iVar5 != 4; iVar5 = iVar5 + 1) {
          iVar10 = iVar3 * 4 + iVar5;
          iVar6 = Vec_IntEntry(vXors,iVar10);
          if (iVar6 != 0) {
            iVar6 = Vec_IntEntry(vXors,iVar10);
            iVar6 = Vec_IntEntry(vMapXors,iVar6);
            fprintf(__stream,"Node%d",(ulong)uVar1);
            fwrite(" -> ",4,1,__stream);
            iVar10 = Vec_IntEntry(vXors,iVar10);
            uVar4 = Gia_ShowAddOut(vAdds,vMapAdds,iVar10);
            fprintf(__stream,"Node%d",(ulong)uVar4);
            fwrite(" [",2,1,__stream);
            pcVar11 = "solid";
            if (-1 < iVar6) {
              pcVar11 = "bold";
            }
            fprintf(__stream,"style = %s",pcVar11);
            fputc(0x5d,__stream);
            fwrite(";\n",2,1,__stream);
          }
        }
      }
    }
    else {
      iVar3 = Vec_IntEntry(vMapAdds,uVar1);
      for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
        iVar10 = iVar3 * 6 + iVar5;
        iVar6 = Vec_IntEntry(vAdds,iVar10);
        if (iVar6 != 0) {
          iVar6 = Vec_IntEntry(vAdds,iVar10);
          iVar6 = Vec_IntEntry(vMapAdds,iVar6);
          pcVar11 = "solid";
          if (-1 < iVar6) {
            iVar6 = Vec_IntEntry(vAdds,iVar6 * 6 + 3);
            iVar7 = Vec_IntEntry(vAdds,iVar10);
            pcVar11 = "solid";
            if (iVar6 == iVar7) {
              pcVar11 = "bold";
            }
          }
          uVar4 = Gia_ShowAddOut(vAdds,vMapAdds,uVar1);
          fprintf(__stream,"Node%d",(ulong)uVar4);
          fwrite(" -> ",4,1,__stream);
          iVar6 = Vec_IntEntry(vAdds,iVar10);
          uVar4 = Gia_ShowAddOut(vAdds,vMapAdds,iVar6);
          fprintf(__stream,"Node%d",(ulong)uVar4);
          fwrite(" [",2,1,__stream);
          fprintf(__stream,"style = %s",pcVar11);
          fputc(0x5d,__stream);
          fwrite(";\n",2,1,__stream);
        }
      }
    }
    iVar2 = iVar2 + 1;
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if (vBold != (Vec_Int_t *)0x0) {
    for (iVar2 = 0; iVar2 < vBold->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(vBold,iVar2);
      pGVar8 = Gia_ManObj(p,iVar3);
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      pGVar8->field_0x3 = pGVar8->field_0x3 & 0xbf;
    }
  }
  Vec_IntFreeP(&p->vLevels);
  return;
}

Assistant:

void Gia_WriteDotAig( Gia_Man_t * p, char * pFileName, Vec_Int_t * vBold, Vec_Int_t * vAdds, Vec_Int_t * vXors, Vec_Int_t * vMapAdds, Vec_Int_t * vMapXors, Vec_Int_t * vOrder )
{
    FILE * pFile;
    Gia_Obj_t * pNode;//, * pTemp, * pPrev;
    int LevelMax, Prev, Level, i;
    int fConstIsUsed = 0;
    int nFadds = Ree_ManCountFadds( vAdds );

    if ( Gia_ManAndNum(p) > NODE_MAX )
    {
        fprintf( stdout, "Cannot visualize AIG with more than %d nodes.\n", NODE_MAX );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 1;

    // compute levels
    LevelMax = 1 + p->nLevels;
    Gia_ManForEachCo( p, pNode, i )
        Vec_IntWriteEntry( p->vLevels, Gia_ObjId(p, pNode), LevelMax );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "AIG structure generated by GIA package" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph AIG {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "AIG structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", "aig" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The AIG contains %d nodes, %d full-adders, and %d half-adders, and spans %d levels.", 
        Gia_ManAndNum(p), nFadds, Vec_IntSize(vAdds)/6-nFadds, LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( Gia_ObjFaninId0p(p, pNode) == 0 )
            fConstIsUsed = 1;
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "invtriangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Gia_ManForEachObjVec( vOrder, p, pNode, i )
        {
            int iNode = Gia_ObjId( p, pNode );
            if ( (int)Gia_ObjLevel(p, pNode) != Level )
                continue;
/*
            fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 
            if ( Gia_ObjIsXor(pNode) )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( Gia_ObjIsMux(p, pNode) )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );
*/
            if ( !pNode->fMark0 && Vec_IntEntry(vMapAdds, iNode) >= 0 )
            {
                int iBox = Vec_IntEntry(vMapAdds, iNode);
                fprintf( pFile, "  Node%d [label = \"%d_%d\"", Gia_ShowAddOut(vAdds, vMapAdds, iNode), Vec_IntEntry(vAdds, 6*iBox+3), Vec_IntEntry(vAdds, 6*iBox+4) ); 
                if ( Vec_IntEntry(vAdds, 6*iBox+2) == 0 )
                    fprintf( pFile, ", shape = octagon" );
                else 
                    fprintf( pFile, ", shape = doubleoctagon" );
            }
            else if ( Vec_IntEntry(vMapXors, iNode) >= 0 )
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = doublecircle" );
            }
            else if ( Gia_ObjIsXor(pNode) )
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = doublecircle" );
            }
            else if ( Gia_ObjIsMux(p, pNode) )
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = trapezium" );
            }
            else
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = ellipse" );
            }
            if ( pNode->fMark0 )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate constant node
    if ( fConstIsUsed )
    {
        // check if the costant node is present
        fprintf( pFile, "  Node%d [label = \"Const0\"", 0 );
        fprintf( pFile, ", shape = ellipse" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    // generate the CI nodes
    Gia_ManForEachCi( p, pNode, i )
    {
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "triangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Gia_ManForEachCo( p, pNode, i )
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", Gia_ObjId(p, pNode) );
    // generate invisible edges among the COs
    Prev = -1;
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Gia_ManForEachCi( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }

    // generate edges
    Gia_ManForEachCo( p, pNode, i )
    {
        int iNode = Gia_ObjId( p, pNode );
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId0(pNode, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC0(pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }
    Gia_ManForEachObjVec( vOrder, p, pNode, i )
    {
        int iNode = Gia_ObjId( p, pNode );
        if ( Vec_IntEntry(vMapAdds, Gia_ObjId(p, pNode)) >= 0 )
        {
            int k, iBox = Vec_IntEntry(vMapAdds, iNode);
            for ( k = 0; k < 3; k++ )
                if ( Vec_IntEntry(vAdds, 6*iBox+k) )
                {
                    int iBox2 = Vec_IntEntry(vMapAdds, Vec_IntEntry(vAdds, 6*iBox+k));
                    int fXor2 = iBox2 >= 0 ? (int)(Vec_IntEntry(vAdds, 6*iBox2+3) == Vec_IntEntry(vAdds, 6*iBox+k)) : 0;
                    fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, iNode) );
                    fprintf( pFile, " -> " );
                    fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Vec_IntEntry(vAdds, 6*iBox+k)) );
                    fprintf( pFile, " [" );
                    fprintf( pFile, "style = %s", fXor2? "bold" : "solid" );
                    fprintf( pFile, "]" );
                    fprintf( pFile, ";\n" );
                }
            continue;
        }
        if ( Vec_IntEntry(vMapXors, Gia_ObjId(p, pNode)) >= 0 )
        {
            int k, iXor = Vec_IntEntry(vMapXors, iNode);
            for ( k = 1; k < 4; k++ )
                if ( Vec_IntEntry(vXors, 4*iXor+k) )
                {
                    int iXor2 = Vec_IntEntry(vMapXors, Vec_IntEntry(vXors, 4*iXor+k));
                    fprintf( pFile, "Node%d",  iNode );
                    fprintf( pFile, " -> " );
                    fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Vec_IntEntry(vXors, 4*iXor+k)) );
                    fprintf( pFile, " [" );
                    fprintf( pFile, "style = %s", iXor2 >= 0? "bold" : "solid" );
                    fprintf( pFile, "]" );
                    fprintf( pFile, ";\n" );
                }
            continue;
        }
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId0(pNode, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC0(pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
        if ( !Gia_ObjIsAnd(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId1(pNode, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC1(pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );

        if ( !Gia_ObjIsMux(p, pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId2(p, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC2(p, pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 0;

    Vec_IntFreeP( &p->vLevels );
}